

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O2

ConstantValue * __thiscall
slang::ast::builtins::IsUnboundedFunction::eval
          (ConstantValue *__return_storage_ptr__,IsUnboundedFunction *this,EvalContext *context,
          Args *args,SourceRange range,SystemCallInfo *param_4)

{
  bool bVar1;
  reference ppEVar2;
  Type *this_00;
  Symbol *this_01;
  ParameterSymbol *this_02;
  ConstantValue *pCVar3;
  uint64_t value;
  SVInt local_40;
  
  ppEVar2 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
            operator[](args,0);
  SystemSubroutine::noHierarchical(&this->super_SystemSubroutine,context,*ppEVar2);
  ppEVar2 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
            operator[](args,0);
  this_00 = not_null<const_slang::ast::Type_*>::get(&(*ppEVar2)->type);
  bVar1 = Type::isUnbounded(this_00);
  if (bVar1) {
LAB_002f33fc:
    value = 1;
  }
  else {
    ppEVar2 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
              operator[](args,0);
    if ((*ppEVar2)->kind == NamedValue) {
      ppEVar2 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>
                ::operator[](args,0);
      this_01 = Expression::getSymbolReference(*ppEVar2,true);
      if ((this_01 != (Symbol *)0x0) && (this_01->kind == Parameter)) {
        this_02 = Symbol::as<slang::ast::ParameterSymbol>(this_01);
        pCVar3 = ParameterSymbol::getValue(this_02,range);
        if (*(__index_type *)
             ((long)&(pCVar3->value).
                     super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             + 0x20) == '\n') goto LAB_002f33fc;
      }
    }
    value = 0;
  }
  SVInt::SVInt(&local_40,1,value,false);
  std::
  variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
  ::variant<slang::SVInt,void,void,slang::SVInt,void>
            ((variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
              *)__return_storage_ptr__,&local_40);
  SVInt::~SVInt(&local_40);
  return __return_storage_ptr__;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange range,
                       const CallExpression::SystemCallInfo&) const final {
        noHierarchical(context, *args[0]);

        if (args[0]->type->isUnbounded())
            return SVInt(1, 1, false);

        if (args[0]->kind == ExpressionKind::NamedValue) {
            auto sym = args[0]->getSymbolReference();
            if (sym && sym->kind == SymbolKind::Parameter &&
                sym->as<ParameterSymbol>().getValue(range).isUnbounded())
                return SVInt(1, 1, false);
        }

        return SVInt(1, 0, false);
    }